

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O2

bool basisu::unpack_pvrtc2(void *p,color_rgba *pPixels)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar7;
  uint32_t i;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  color_rgba colors [4];
  color_rgba color_b;
  color_rgba color_a;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_48;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_44;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_40;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_3c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_38;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_34;
  
  uVar1 = *(uint *)((long)p + 4);
  if ((uVar1 & 0x8001) == 0x8000) {
    if ((int)uVar1 < 0) {
      uVar3 = uVar1 >> 1 & 0xf;
      local_34.m_comps[2] = (char)(uVar3 >> 3) + (char)uVar3 * '\x02';
      local_34.m_comps[0] = (byte)(uVar1 >> 10) & 0x1f;
      local_34.m_comps[1] = (byte)(uVar1 >> 5) & 0x1f;
      local_34.m_comps[3] = 0xff;
      local_38.m_comps[0] = (byte)(uVar1 >> 0x1a) & 0x1f;
      local_38.m_comps[1] = (byte)(uVar1 >> 0x15) & 0x1f;
      local_38.m_comps[2] = (byte)(uVar1 >> 0x10) & 0x1f;
      local_38.m_comps[3] = 0xff;
      aVar7.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgb_555_to_888((color_rgba *)&local_34.field_1);
      local_48.field_1 = aVar7.field_1;
      local_3c.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgb_555_to_888((color_rgba *)&local_38.field_1);
      uVar6 = ((uint)local_3c & 0xff) * 3 + ((uint)aVar7 & 0xff) * 5 >> 3;
      uVar9 = (uint)aVar7 >> 8 & 0xff;
      uVar10 = (uint)local_3c >> 8 & 0xff;
      uVar5 = uVar10 * 3 + uVar9 * 5 >> 3;
      uVar11 = (uint)aVar7 >> 0x10 & 0xff;
      uVar3 = (uint)local_3c >> 0x10 & 0xff;
      uVar4 = uVar3 * 3 + uVar11 * 5 >> 3;
      local_44.m_comps[0] = (uint8_t)uVar6;
      local_44.m_comps[1] = (uint8_t)uVar5;
      local_44.m_comps[2] = (uint8_t)uVar4;
      local_44.m_comps[3] = 0xff;
      local_40.m_comps[0] = (uint8_t)(((uint)local_3c & 0xff) * 5 + ((uint)aVar7 & 0xff) * 3 >> 3);
      local_40.m_comps[1] = (uint8_t)(uVar10 * 5 + uVar9 * 3 >> 3);
      local_40.m_comps[2] = (uint8_t)(uVar3 * 5 + uVar11 * 3 >> 3);
      local_40.m_comps[3] = 0xff;
    }
    else {
      uVar3 = uVar1 >> 8 & 0xf;
      uVar4 = uVar1 >> 4 & 0xf;
      uVar5 = uVar1 >> 1 & 7;
      color_rgba::set((color_rgba *)&local_34.field_1,(uVar3 >> 3) + uVar3 * 2,
                      (uVar4 >> 3) + uVar4 * 2,(uVar5 >> 1) + uVar5 * 4,uVar1 >> 0xb & 0xe);
      uVar3 = *(uint *)((long)p + 4);
      uVar4 = uVar3 >> 0x18 & 0xf;
      uVar5 = uVar3 >> 0x14 & 0xf;
      uVar6 = uVar3 >> 0x10 & 0xf;
      color_rgba::set((color_rgba *)&local_38.field_1,(uVar4 >> 3) + uVar4 * 2,
                      (uVar5 >> 3) + uVar5 * 2,(uVar6 >> 3) + uVar6 * 2,(uVar3 >> 0x1b & 0xe) + 1);
      aVar7.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgba_5554_to_8888((color_rgba *)&local_34.field_1);
      local_48.field_1 = aVar7.field_1;
      local_3c.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           convert_rgba_5554_to_8888((color_rgba *)&local_38.field_1);
      uVar6 = ((uint)local_3c & 0xff) * 3 + ((uint)aVar7 & 0xff) * 5 >> 3;
      uVar5 = ((uint)local_3c >> 8 & 0xff) * 3 + ((uint)aVar7 >> 8 & 0xff) * 5 >> 3;
      uVar4 = ((uint)local_3c >> 0x10 & 0xff) * 3 + ((uint)aVar7 >> 0x10 & 0xff) * 5 >> 3;
    }
    color_rgba::set((color_rgba *)&local_44.field_1,uVar6,uVar5,uVar4,
                    ((uint)local_3c >> 0x18) * 3 + ((uint)aVar7 >> 0x18) * 5 >> 3);
    color_rgba::set((color_rgba *)&local_40.field_1,
                    ((uint)local_3c & 0xff) + ((uint)local_3c & 0xff) * 4 +
                    ((uint)local_48 & 0xff) + ((uint)local_48 & 0xff) * 2 >> 3,
                    (uint)(byte)local_3c._1_1_ + (uint)(byte)local_3c._1_1_ * 4 +
                    (uint)local_48.m_comps[1] + (uint)local_48.m_comps[1] * 2 >> 3,
                    (uint)(byte)local_3c._2_1_ + (uint)(byte)local_3c._2_1_ * 4 +
                    (uint)local_48.m_comps[2] + (uint)local_48.m_comps[2] * 2 >> 3,
                    (uint)(byte)local_3c._3_1_ + (uint)(byte)local_3c._3_1_ * 4 +
                    (uint)local_48.m_comps[3] + (uint)local_48.m_comps[3] * 2 >> 3);
    bVar2 = 0;
    for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
      pPixels[uVar8].field_0 =
           (&local_48)[*(byte *)((long)p + (uVar8 >> 2 & 0x3fffffff)) >> (bVar2 & 6) & 3];
      bVar2 = bVar2 + 2;
    }
  }
  return (uVar1 & 0x8001) == 0x8000;
}

Assistant:

bool unpack_pvrtc2(const void *p, color_rgba *pPixels)
	{
		const pvrtc2_block* pBlock = static_cast<const pvrtc2_block*>(p);

		if ((!pBlock->m_opaque_color_data.m_hard_flag) || (pBlock->m_opaque_color_data.m_mod_flag))
		{
			// This mode isn't supported by the transcoder, so we aren't bothering with it here.
			return false;
		}

		color_rgba colors[4];

		if (pBlock->m_opaque_color_data.m_opaque_flag)
		{
			// colora=554
			color_rgba color_a(pBlock->m_opaque_color_data.m_red_a, pBlock->m_opaque_color_data.m_green_a, (pBlock->m_opaque_color_data.m_blue_a << 1) | (pBlock->m_opaque_color_data.m_blue_a >> 3), 255);
			
			// colora=555
			color_rgba color_b(pBlock->m_opaque_color_data.m_red_b, pBlock->m_opaque_color_data.m_green_b, pBlock->m_opaque_color_data.m_blue_b, 255);
						
			colors[0] = convert_rgb_555_to_888(color_a);
			colors[3] = convert_rgb_555_to_888(color_b);

			colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, 255);
			colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, 255);
		}
		else
		{
			// colora=4433 
			color_rgba color_a(
				(pBlock->m_trans_color_data.m_red_a << 1) | (pBlock->m_trans_color_data.m_red_a >> 3), 
				(pBlock->m_trans_color_data.m_green_a << 1) | (pBlock->m_trans_color_data.m_green_a >> 3),
				(pBlock->m_trans_color_data.m_blue_a << 2) | (pBlock->m_trans_color_data.m_blue_a >> 1), 
				pBlock->m_trans_color_data.m_alpha_a << 1);

			//colorb=4443
			color_rgba color_b(
				(pBlock->m_trans_color_data.m_red_b << 1) | (pBlock->m_trans_color_data.m_red_b >> 3),
				(pBlock->m_trans_color_data.m_green_b << 1) | (pBlock->m_trans_color_data.m_green_b >> 3),
				(pBlock->m_trans_color_data.m_blue_b << 1) | (pBlock->m_trans_color_data.m_blue_b >> 3),
				(pBlock->m_trans_color_data.m_alpha_b << 1) | 1);

			colors[0] = convert_rgba_5554_to_8888(color_a);
			colors[3] = convert_rgba_5554_to_8888(color_b);
		}

		colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, (colors[0].a * 5 + colors[3].a * 3) / 8);
		colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, (colors[0].a * 3 + colors[3].a * 5) / 8);

		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t sel = (pBlock->m_modulation[i >> 2] >> ((i & 3) * 2)) & 3;
			pPixels[i] = colors[sel];
		}

		return true;
	}